

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

void list_prepend_to(list_t *list,void *data,list_node_t *old)

{
  list_node_t *plVar1;
  list_node_t *plVar2;
  
  plVar2 = (list_node_t *)calloc(1,0x18);
  plVar2->data = data;
  plVar1 = old->prev;
  if (plVar1 != (list_node_t *)0x0) {
    list = (list_t *)plVar1;
  }
  ((list_node_t *)list)->next = plVar2;
  plVar2->prev = plVar1;
  plVar2->next = old;
  old->prev = plVar2;
  return;
}

Assistant:

void
list_prepend_to(
    list_t* list,
    void* data,
    list_node_t* old)
{
    list_node_t* new = list_node_new();
    new->data = data;

    if (old->prev)
        old->prev->next = new;
    else
        list->head = new;
    new->prev = old->prev;
    new->next = old;
    old->prev = new;
}